

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_drop_modules(sqlite3 *db,char **azNames)

{
  void *pvVar1;
  int iVar2;
  bool bVar3;
  int local_34;
  int ii;
  Module *pMod;
  HashElem *pNext;
  HashElem *pThis;
  char **azNames_local;
  sqlite3 *db_local;
  
  pNext = (db->aModule).first;
LAB_001c332f:
  if (pNext == (HashElem *)0x0) {
    return 0;
  }
  pvVar1 = pNext->data;
  pNext = pNext->next;
  if (azNames != (char **)0x0) goto code_r0x001c3358;
  goto LAB_001c33be;
code_r0x001c3358:
  local_34 = 0;
  while( true ) {
    bVar3 = false;
    if (azNames[local_34] != (char *)0x0) {
      iVar2 = strcmp(azNames[local_34],*(char **)((long)pvVar1 + 8));
      bVar3 = iVar2 != 0;
    }
    if (!bVar3) break;
    local_34 = local_34 + 1;
  }
  if (azNames[local_34] == (char *)0x0) {
LAB_001c33be:
    createModule(db,*(char **)((long)pvVar1 + 8),(sqlite3_module *)0x0,(void *)0x0,
                 (_func_void_void_ptr *)0x0);
  }
  goto LAB_001c332f;
}

Assistant:

SQLITE_API int sqlite3_drop_modules(sqlite3 *db, const char** azNames){
  HashElem *pThis, *pNext;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  for(pThis=sqliteHashFirst(&db->aModule); pThis; pThis=pNext){
    Module *pMod = (Module*)sqliteHashData(pThis);
    pNext = sqliteHashNext(pThis);
    if( azNames ){
      int ii;
      for(ii=0; azNames[ii]!=0 && strcmp(azNames[ii],pMod->zName)!=0; ii++){}
      if( azNames[ii]!=0 ) continue;
    }
    createModule(db, pMod->zName, 0, 0, 0);
  }
  return SQLITE_OK;
}